

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_ClassArray<ON_BrepLoop>::Append(ON_ClassArray<ON_BrepLoop> *this,int count,ON_BrepLoop *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (p != (ON_BrepLoop *)0x0 && 0 < count) {
    uVar1 = this->m_count;
    uVar3 = uVar1 + count;
    if (this->m_capacity < (int)uVar3) {
      if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0x78) < 0x10000001)) {
        uVar4 = 4;
        if (2 < (int)uVar1) {
          uVar4 = uVar1 * 2;
        }
      }
      else {
        uVar4 = 0x22222a;
        if (uVar1 < 0x22222a) {
          uVar4 = uVar1;
        }
        uVar4 = uVar4 + uVar1;
      }
      if ((int)uVar3 < (int)uVar4) {
        uVar3 = uVar4;
      }
      if ((uint)this->m_capacity < uVar3) {
        SetCapacity(this,(long)(int)uVar3);
      }
    }
    uVar5 = (ulong)(uint)count;
    do {
      iVar2 = this->m_count;
      this->m_count = iVar2 + 1;
      ON_BrepLoop::operator=(this->m_a + iVar2,p);
      p = p + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}